

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_make_unsigned_integer_from_luint(sexp ctx,sexp_luint_t x)

{
  sexp in_RDX;
  ulong in_RSI;
  sexp res;
  sexp local_40;
  
  if (in_RSI >> 0x3e == 0 && in_RDX == (sexp)0x0) {
    local_40 = (sexp)(in_RSI << 1 | 1);
  }
  else if (in_RDX == (sexp)0x0) {
    local_40 = sexp_make_bignum((sexp)0x0,in_RSI);
    (local_40->value).flonum_bits[0] = '\x01';
    (local_40->value).string.length = in_RSI;
  }
  else {
    local_40 = sexp_make_bignum(in_RDX,in_RSI);
    (local_40->value).flonum_bits[0] = '\x01';
    (local_40->value).string.length = in_RSI;
    (local_40->value).type.getters = in_RDX;
  }
  return local_40;
}

Assistant:

sexp sexp_make_unsigned_integer_from_luint (sexp ctx, sexp_luint_t x) {
  sexp res;
  if (luint_is_fixnum(x)) {
    res = sexp_make_fixnum(luint_to_uint(x));
  } else if (sexp_luint_fits_uint(x)) {
    res = sexp_make_bignum(ctx, 1);
    sexp_bignum_sign(res) = 1;
    sexp_bignum_data(res)[0] = luint_to_uint(x);
  } else {
    res = sexp_make_bignum(ctx, 2);
    sexp_bignum_sign(res) = 1;
    sexp_bignum_data(res)[0] = luint_to_uint(x);
    sexp_bignum_data(res)[1] = luint_to_uint_hi(x);
  }
  return res;
}